

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall GroundScene::processSignal(GroundScene *this,SceneSignal *signal)

{
  Plant *pPVar1;
  
  if (signal->type == 2) {
    pPVar1 = this->plants[this->selectY][this->selectX];
    if (pPVar1 != (Plant *)0x0) {
      (*(pPVar1->super_Charactor).super_Object._vptr_Object[6])();
      this->plants[this->selectY][this->selectX] = (Plant *)0x0;
    }
  }
  else if (signal->type == 1) {
    genPlant(this,this->selectX,this->selectY,signal->data);
    return;
  }
  return;
}

Assistant:

void GroundScene::processSignal(SceneSignal& signal){
	if(signal.type == SS_SIGNAL_GEN_PLANT){
		genPlant(selectX, selectY, signal.data);
	}
	else if(signal.type == SS_SIGNAL_REMOVE_PLANT){
		if(plants[selectY][selectX]){
			plants[selectY][selectX]->die();
			plants[selectY][selectX] = NULL;
		}
	}
}